

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::CatalogSet::DropDependencies
          (CatalogSet *this,CatalogTransaction transaction,string *name,bool cascade,
          bool allow_drop_internal)

{
  pointer pcVar1;
  undefined8 this_00;
  int iVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  undefined4 extraout_var;
  CatalogException *this_01;
  EntryLookup EVar4;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  optional_ptr<duckdb::CatalogEntry,_true> local_78;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  EVar4 = GetEntryDetailed(this,transaction,name);
  oVar3 = EVar4.result.ptr;
  if (oVar3.ptr != (CatalogEntry *)0x0) {
    local_78.ptr = oVar3.ptr;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    if ((local_78.ptr)->internal == true && !allow_drop_internal) {
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_70._0_8_ = local_70 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,
                 "Cannot drop entry \"%s\" because it is an internal system entry","");
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = ((local_78.ptr)->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + ((local_78.ptr)->name)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>(this_01,(string *)local_70,&local_50)
      ;
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    iVar2 = (*(local_78.ptr)->_vptr_CatalogEntry[0xb])();
    local_70._0_8_ =
         (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xd0))
                   ((long *)CONCAT44(extraout_var,iVar2));
    optional_ptr<duckdb::DependencyManager,_true>::CheckValid
              ((optional_ptr<duckdb::DependencyManager,_true> *)local_70);
    this_00 = local_70._0_8_;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    DependencyManager::DropObject((DependencyManager *)this_00,transaction,local_78.ptr,cascade);
  }
  return oVar3.ptr != (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::DropDependencies(CatalogTransaction transaction, const string &name, bool cascade,
                                  bool allow_drop_internal) {
	auto entry = GetEntry(transaction, name);
	if (!entry) {
		return false;
	}
	if (entry->internal && !allow_drop_internal) {
		throw CatalogException("Cannot drop entry \"%s\" because it is an internal system entry", entry->name);
	}
	// check any dependencies of this object
	D_ASSERT(entry->ParentCatalog().IsDuckCatalog());
	auto &duck_catalog = entry->ParentCatalog().Cast<DuckCatalog>();
	duck_catalog.GetDependencyManager()->DropObject(transaction, *entry, cascade);
	return true;
}